

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<unsigned_short>,testing::Matcher<unsigned_char>>,std::tuple<unsigned_short,unsigned_char>>
               (tuple<testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_> *matchers,
               tuple<unsigned_short,_unsigned_char> *values,ostream *os)

{
  bool bVar1;
  __tuple_element_t<1UL,_tuple<Matcher<unsigned_short>,_Matcher<unsigned_char>_>_> *p_Var2;
  ostream *poVar3;
  MatcherBase<unsigned_char> *this;
  string local_208;
  undefined1 local_1d8 [8];
  StringMatchResultListener listener;
  type value;
  type matcher;
  ostream *os_local;
  tuple<unsigned_short,_unsigned_char> *values_local;
  tuple<testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_char>_> *matchers_local;
  
  matcher.super_MatcherBase<unsigned_char>.impl_.link_.next_ = (linked_ptr_internal *)os;
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<unsigned_short>,testing::Matcher<unsigned_char>>,std::tuple<unsigned_short,unsigned_char>>
            (matchers,values,os);
  p_Var2 = std::get<1ul,testing::Matcher<unsigned_short>,testing::Matcher<unsigned_char>>(matchers);
  Matcher<unsigned_char>::Matcher((Matcher<unsigned_char> *)&value,p_Var2);
  listener._400_8_ = std::get<1ul,unsigned_short,unsigned_char>(values);
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1d8);
  bVar1 = MatcherBase<unsigned_char>::MatchAndExplain
                    ((MatcherBase<unsigned_char> *)&value,(type)listener._400_8_,
                     (MatchResultListener *)local_1d8);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)matcher.super_MatcherBase<unsigned_char>.impl_.link_.next_,
                             "  Expected arg #");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    std::operator<<(poVar3,": ");
    this = &std::get<1ul,testing::Matcher<unsigned_short>,testing::Matcher<unsigned_char>>(matchers)
            ->super_MatcherBase<unsigned_char>;
    MatcherBase<unsigned_char>::DescribeTo
              (this,(ostream *)matcher.super_MatcherBase<unsigned_char>.impl_.link_.next_);
    std::operator<<((ostream *)matcher.super_MatcherBase<unsigned_char>.impl_.link_.next_,
                    "\n           Actual: ");
    UniversalPrint<unsigned_char>
              ((uchar *)listener._400_8_,
               (ostream *)matcher.super_MatcherBase<unsigned_char>.impl_.link_.next_);
    StringMatchResultListener::str_abi_cxx11_(&local_208,(StringMatchResultListener *)local_1d8);
    PrintIfNotEmpty(&local_208,(ostream *)matcher.super_MatcherBase<unsigned_char>.impl_.link_.next_
                   );
    std::__cxx11::string::~string((string *)&local_208);
    std::operator<<((ostream *)matcher.super_MatcherBase<unsigned_char>.impl_.link_.next_,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1d8);
  Matcher<unsigned_char>::~Matcher((Matcher<unsigned_char> *)&value);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    GTEST_REFERENCE_TO_CONST_(Value) value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // FIXME: include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }